

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O2

void __thiscall ON_ContentHash::Cache::Cache(Cache *this)

{
  __shared_ptr<std::unordered_map<std::__cxx11::wstring,ON_ContentHash,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,ON_ContentHash>>>,(__gnu_cxx::_Lock_policy)2>
  *this_00;
  Private *pPVar1;
  unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash>_>_>
  *__p;
  __shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_20;
  
  pPVar1 = (Private *)operator_new(0x10);
  (pPVar1->p).
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (pPVar1->p).
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_private = pPVar1;
  std::
  __shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_20,&g_pContentHashCache_abi_cxx11_);
  std::
  __shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash>_>_>,_(__gnu_cxx::_Lock_policy)2>
               *)this->m_private,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  this_00 = (__shared_ptr<std::unordered_map<std::__cxx11::wstring,ON_ContentHash,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,ON_ContentHash>>>,(__gnu_cxx::_Lock_policy)2>
             *)this->m_private;
  if (*(long *)&this_00->field_0x0 == 0) {
    __p = (unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash>_>_>
           *)operator_new(0x38);
    (__p->_M_h)._M_buckets = &(__p->_M_h)._M_single_bucket;
    (__p->_M_h)._M_bucket_count = 1;
    (__p->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p->_M_h)._M_element_count = 0;
    (__p->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__p->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__p->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    std::
    __shared_ptr<std::unordered_map<std::__cxx11::wstring,ON_ContentHash,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,ON_ContentHash>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    reset<std::unordered_map<std::__cxx11::wstring,ON_ContentHash,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,ON_ContentHash>>>>
              (this_00,__p);
    std::
    __weak_ptr<std::unordered_map<std::__cxx11::wstring,ON_ContentHash,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,ON_ContentHash>>>,(__gnu_cxx::_Lock_policy)2>
    ::operator=((__weak_ptr<std::unordered_map<std::__cxx11::wstring,ON_ContentHash,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,ON_ContentHash>>>,(__gnu_cxx::_Lock_policy)2>
                 *)&g_pContentHashCache_abi_cxx11_,
                (__shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_ON_ContentHash>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)this->m_private);
  }
  return;
}

Assistant:

ON_ContentHash::Cache::Cache()
  : m_private(new Private)
{
  
  m_private->p = g_pContentHashCache.lock();


  if (!m_private->p)
  {
    m_private->p.reset(new ContentHashMap);
    g_pContentHashCache = m_private->p;
  }
}